

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

void helicsFilterAddDestinationTarget(HelicsFilter filt,char *dest,HelicsError *err)

{
  string_view newTarget;
  Filter *pFVar1;
  HelicsError *in_RDX;
  long in_RSI;
  Filter *filter;
  HelicsError *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  InterfaceType in_stack_ffffffffffffffcf;
  Interface *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilter
                     ((HelicsFilter)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
  if (pFVar1 != (Filter *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      newTarget._M_str = (char *)pFVar1;
      newTarget._M_len = in_stack_ffffffffffffffd8;
      helics::Interface::addDestinationTarget
                (in_stack_ffffffffffffffd0,newTarget,in_stack_ffffffffffffffcf);
    }
  }
  return;
}

Assistant:

void helicsFilterAddDestinationTarget(HelicsFilter filt, const char* dest, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(dest, void());
    try {
        filter->addDestinationTarget(dest);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}